

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_NtkBalanceTwo(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,int i,int j,Vec_Int_t *vDelay,
                     int *pCost,int *pSuper,word *pMatrix,int nSize,int nLutSize,int CostBest)

{
  word wVar1;
  int iVar2;
  word t_2;
  int t_1;
  int t;
  int Delay;
  int iLitRes;
  int k;
  Vec_Int_t *vDelay_local;
  int j_local;
  int i_local;
  Str_Obj_t *pObj_local;
  Str_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (i < j) {
    if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
      t = Gia_ManHashAnd(pNew,pSuper[i],pSuper[j]);
    }
    else {
      t = Gia_ManHashXorReal(pNew,pSuper[i],pSuper[j]);
    }
    iVar2 = Abc_Lit2Var(t);
    iVar2 = Str_ObjDelay(pNew,iVar2,nLutSize,vDelay);
    pCost[i] = iVar2;
    pSuper[i] = t;
    pMatrix[i] = pMatrix[j] | pMatrix[i];
    for (Delay = j; Delay < nSize + -1; Delay = Delay + 1) {
      pCost[Delay] = pCost[Delay + 1];
      pSuper[Delay] = pSuper[Delay + 1];
      pMatrix[Delay] = pMatrix[Delay + 1];
    }
    for (Delay = 0; (Delay < nSize + -2 && (pCost[Delay + 1] < pCost[Delay])); Delay = Delay + 1) {
      iVar2 = pCost[Delay];
      pCost[Delay] = pCost[Delay + 1];
      pCost[Delay + 1] = iVar2;
      iVar2 = pSuper[Delay];
      pSuper[Delay] = pSuper[Delay + 1];
      pSuper[Delay + 1] = iVar2;
      wVar1 = pMatrix[Delay];
      pMatrix[Delay] = pMatrix[Delay + 1];
      pMatrix[Delay + 1] = wVar1;
    }
    return t;
  }
  __assert_fail("i < j",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,0x420,
                "int Str_NtkBalanceTwo(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, int, int, Vec_Int_t *, int *, int *, word *, int, int, int)"
               );
}

Assistant:

int Str_NtkBalanceTwo( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, int i, int j, Vec_Int_t * vDelay, int * pCost, int * pSuper, word * pMatrix, int nSize, int nLutSize, int CostBest )
{
    int k, iLitRes, Delay;
    assert( i < j );
//    printf( "Merging node %d and %d\n", i, j );
    if ( pObj->Type == STR_AND )
        iLitRes = Gia_ManHashAnd( pNew, pSuper[i], pSuper[j] );
    else
        iLitRes = Gia_ManHashXorReal( pNew, pSuper[i], pSuper[j] );
    Delay = Str_ObjDelay( pNew, Abc_Lit2Var(iLitRes), nLutSize, vDelay );
    // update
    pCost[i] = Delay;
    pSuper[i] = iLitRes;
    pMatrix[i] |= pMatrix[j];
//    assert( (pCost[i] & 15) == CostBest || CostBest == -1 );
    // remove entry j
    nSize--;
    for ( k = j; k < nSize; k++ )
    {
        pCost[k] = pCost[k+1];
        pSuper[k] = pSuper[k+1];
        pMatrix[k] = pMatrix[k+1];
    }
    // move up the first one
    nSize--;
    for ( k = 0; k < nSize; k++ )
    {
        if ( pCost[k] <= pCost[k+1] )
            break;
        ABC_SWAP( int, pCost[k], pCost[k+1] );
        ABC_SWAP( int, pSuper[k], pSuper[k+1] );
        ABC_SWAP( word, pMatrix[k], pMatrix[k+1] );
    }
    return iLitRes;
}